

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.hpp
# Opt level: O2

Position Position::from_json(Json *json)

{
  uchar uVar1;
  uchar uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Position PVar6;
  const_reference pvVar7;
  bool local_f9;
  allocator<char> local_f8;
  bool local_f7;
  allocator<char> local_f6;
  bool local_f5;
  allocator<char> local_f4;
  allocator<char> local_f3;
  allocator<char> local_f2;
  allocator<char> local_f1;
  key_type local_f0;
  key_type local_d0;
  key_type local_b0;
  key_type local_90;
  key_type local_70;
  key_type local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"x",&local_f1);
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_50);
  PVar6.x = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<unsigned_char,_0>(pvVar7);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"y",&local_f2);
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_70);
  uVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<unsigned_char,_0>(pvVar7);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"z",&local_f3);
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_90);
  uVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<unsigned_char,_0>(pvVar7);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"halfX",&local_f4);
  local_f5 = false;
  bVar3 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::value<bool,_0>(json,&local_b0,&local_f5);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"halfY",&local_f6);
  local_f7 = false;
  bVar4 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::value<bool,_0>(json,&local_d0,&local_f7);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"halfZ",&local_f8);
  local_f9 = false;
  bVar5 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::value<bool,_0>(json,&local_f0,&local_f9);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  PVar6.y = uVar1;
  PVar6.z = uVar2;
  PVar6.half_x = bVar3;
  PVar6.half_y = bVar4;
  PVar6.half_z = bVar5;
  return PVar6;
}

Assistant:

static Position from_json(const Json& json)
    {
        return {
            json.at("x"), json.at("y"), json.at("z"),
            json.value("halfX", false), json.value("halfY", false), json.value("halfZ", false)
        };
    }